

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3AlterBeginAddColumn(Parse *pParse,SrcList *pSrc)

{
  sqlite3 *db_00;
  int iVar1;
  Table *pTab_00;
  Table *pTVar2;
  Column *pCVar3;
  char *pcVar4;
  Column *pCol;
  sqlite3 *db;
  int local_30;
  int nAlloc;
  int i;
  int iDb;
  Table *pTab;
  Table *pNew;
  SrcList *pSrc_local;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  if ((db_00->mallocFailed == '\0') &&
     (pTab_00 = sqlite3LocateTableItem(pParse,0,pSrc->a), pTab_00 != (Table *)0x0)) {
    if (pTab_00->nModuleArg == 0) {
      if (pTab_00->pSelect == (Select *)0x0) {
        iVar1 = isAlterableTable(pParse,pTab_00);
        if (iVar1 == 0) {
          iVar1 = sqlite3SchemaToIndex(db_00,pTab_00->pSchema);
          pTVar2 = (Table *)sqlite3DbMallocZero(db_00,0x80);
          if (pTVar2 != (Table *)0x0) {
            pParse->pNewTable = pTVar2;
            pTVar2->nTabRef = 1;
            pTVar2->nCol = pTab_00->nCol;
            pCVar3 = (Column *)
                     sqlite3DbMallocZero(db_00,(long)(((pTVar2->nCol + -1) / 8) * 8 + 8) << 5);
            pTVar2->aCol = pCVar3;
            pcVar4 = sqlite3MPrintf(db_00,"sqlite_altertab_%s",pTab_00->zName);
            pTVar2->zName = pcVar4;
            if ((pTVar2->aCol != (Column *)0x0) && (pTVar2->zName != (char *)0x0)) {
              memcpy(pTVar2->aCol,pTab_00->aCol,(long)pTVar2->nCol << 5);
              for (local_30 = 0; local_30 < pTVar2->nCol; local_30 = local_30 + 1) {
                pCVar3 = pTVar2->aCol + local_30;
                pcVar4 = sqlite3DbStrDup(db_00,pCVar3->zName);
                pCVar3->zName = pcVar4;
                pCVar3->zColl = (char *)0x0;
                pCVar3->pDflt = (Expr *)0x0;
              }
              pTVar2->pSchema = db_00->aDb[iVar1].pSchema;
              pTVar2->addColOffset = pTab_00->addColOffset;
              pTVar2->nTabRef = 1;
            }
          }
        }
      }
      else {
        sqlite3ErrorMsg(pParse,"Cannot add a column to a view");
      }
    }
    else {
      sqlite3ErrorMsg(pParse,"virtual tables may not be altered");
    }
  }
  sqlite3SrcListDelete(db_00,pSrc);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AlterBeginAddColumn(Parse *pParse, SrcList *pSrc){
  Table *pNew;
  Table *pTab;
  int iDb;
  int i;
  int nAlloc;
  sqlite3 *db = pParse->db;

  /* Look up the table being altered. */
  assert( pParse->pNewTable==0 );
  assert( sqlite3BtreeHoldsAllMutexes(db) );
  if( db->mallocFailed ) goto exit_begin_add_column;
  pTab = sqlite3LocateTableItem(pParse, 0, &pSrc->a[0]);
  if( !pTab ) goto exit_begin_add_column;

#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( IsVirtual(pTab) ){
    sqlite3ErrorMsg(pParse, "virtual tables may not be altered");
    goto exit_begin_add_column;
  }
#endif

  /* Make sure this is not an attempt to ALTER a view. */
  if( pTab->pSelect ){
    sqlite3ErrorMsg(pParse, "Cannot add a column to a view");
    goto exit_begin_add_column;
  }
  if( SQLITE_OK!=isAlterableTable(pParse, pTab) ){
    goto exit_begin_add_column;
  }

  assert( pTab->addColOffset>0 );
  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);

  /* Put a copy of the Table struct in Parse.pNewTable for the
  ** sqlite3AddColumn() function and friends to modify.  But modify
  ** the name by adding an "sqlite_altertab_" prefix.  By adding this
  ** prefix, we insure that the name will not collide with an existing
  ** table because user table are not allowed to have the "sqlite_"
  ** prefix on their name.
  */
  pNew = (Table*)sqlite3DbMallocZero(db, sizeof(Table));
  if( !pNew ) goto exit_begin_add_column;
  pParse->pNewTable = pNew;
  pNew->nTabRef = 1;
  pNew->nCol = pTab->nCol;
  assert( pNew->nCol>0 );
  nAlloc = (((pNew->nCol-1)/8)*8)+8;
  assert( nAlloc>=pNew->nCol && nAlloc%8==0 && nAlloc-pNew->nCol<8 );
  pNew->aCol = (Column*)sqlite3DbMallocZero(db, sizeof(Column)*nAlloc);
  pNew->zName = sqlite3MPrintf(db, "sqlite_altertab_%s", pTab->zName);
  if( !pNew->aCol || !pNew->zName ){
    assert( db->mallocFailed );
    goto exit_begin_add_column;
  }
  memcpy(pNew->aCol, pTab->aCol, sizeof(Column)*pNew->nCol);
  for(i=0; i<pNew->nCol; i++){
    Column *pCol = &pNew->aCol[i];
    pCol->zName = sqlite3DbStrDup(db, pCol->zName);
    pCol->zColl = 0;
    pCol->pDflt = 0;
  }
  pNew->pSchema = db->aDb[iDb].pSchema;
  pNew->addColOffset = pTab->addColOffset;
  pNew->nTabRef = 1;

exit_begin_add_column:
  sqlite3SrcListDelete(db, pSrc);
  return;
}